

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::assignToInterface(HlslParseContext *this,TVariable *variable)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *this_00;
  reference ppTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TVariable *variable_00;
  TVariable *splitIoVar;
  __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
  local_38;
  iterator member;
  TVector<glslang::TVariable_*> *memberList;
  anon_class_8_1_8991fb9c assignLocation;
  TVariable *variable_local;
  HlslParseContext *this_local;
  
  memberList = (TVector<glslang::TVariable_*> *)this;
  assignLocation.this = (HlslParseContext *)variable;
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])();
  bVar1 = wasFlattened(this,CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    iVar2 = (*((assignLocation.this)->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0xf])();
    member._M_current = (TVariable **)CONCAT44(extraout_var_00,iVar2);
    this_00 = std::
              map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
              ::operator[](&(this->flattenMap).
                            super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                           ,(key_type_conflict2 *)&member);
    local_38._M_current =
         (TVariable **)
         std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::begin
                   ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_> *)
                    this_00);
    while( true ) {
      splitIoVar = (TVariable *)
                   std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                   ::end((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                          *)this_00);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                          *)&splitIoVar);
      if (!bVar1) break;
      ppTVar3 = __gnu_cxx::
                __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                ::operator*(&local_38);
      assignToInterface::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&memberList,*ppTVar3);
      __gnu_cxx::
      __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
      ::operator++(&local_38);
    }
  }
  else {
    iVar2 = (*((assignLocation.this)->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0xf])();
    bVar1 = wasSplit(this,CONCAT44(extraout_var_01,iVar2));
    if (bVar1) {
      iVar2 = (*((assignLocation.this)->super_TParseContextBase).super_TParseVersions.
                _vptr_TParseVersions[0xf])();
      variable_00 = getSplitNonIoVar(this,CONCAT44(extraout_var_02,iVar2));
      assignToInterface::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&memberList,variable_00);
    }
    else {
      assignToInterface::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&memberList,(TVariable *)assignLocation.this);
    }
  }
  return;
}

Assistant:

void HlslParseContext::assignToInterface(TVariable& variable)
{
    const auto assignLocation = [&](TVariable& variable) {
        TType& type = variable.getWritableType();
        if (!type.isStruct() || type.getStruct()->size() > 0) {
            TQualifier& qualifier = type.getQualifier();
            if (qualifier.storage == EvqVaryingIn || qualifier.storage == EvqVaryingOut) {
                if (qualifier.builtIn == EbvNone && !qualifier.hasLocation()) {
                    // Strip off the outer array dimension for those having an extra one.
                    int size;
                    if (type.isArray() && qualifier.isArrayedIo(language)) {
                        TType elementType(type, 0);
                        size = intermediate.computeTypeLocationSize(elementType, language);
                    } else
                        size = intermediate.computeTypeLocationSize(type, language);

                    if (qualifier.storage == EvqVaryingIn) {
                        variable.getWritableType().getQualifier().layoutLocation = nextInLocation;
                        nextInLocation += size;
                    } else {
                        variable.getWritableType().getQualifier().layoutLocation = nextOutLocation;
                        nextOutLocation += size;
                    }
                }
                trackLinkage(variable);
            }
        }
    };

    if (wasFlattened(variable.getUniqueId())) {
        auto& memberList = flattenMap[variable.getUniqueId()].members;
        for (auto member = memberList.begin(); member != memberList.end(); ++member)
            assignLocation(**member);
    } else if (wasSplit(variable.getUniqueId())) {
        TVariable* splitIoVar = getSplitNonIoVar(variable.getUniqueId());
        assignLocation(*splitIoVar);
    } else {
        assignLocation(variable);
    }
}